

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

vec2 vec2_rotate(vec2 v,float theta)

{
  vec2 vVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 local_28;
  
  fVar2 = cosf(theta);
  fVar3 = sinf(theta);
  fVar4 = cosf(theta);
  fVar5 = sinf(theta);
  local_28 = v.x;
  vVar1.y = fVar4 * v.y + fVar5 * local_28;
  vVar1.x = fVar2 * local_28 + -v.y * fVar3;
  return vVar1;
}

Assistant:

vec2 vec2_rotate(vec2 v, float theta) {
    vec2 u;
    u.x = v.x * cosf(theta) - v.y * sinf(theta);
    u.y = v.y * cosf(theta) + v.x * sinf(theta);
    return u;
}